

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::LogParser::StartElement(LogParser *this)

{
  char **in_RDX;
  string *in_RSI;
  
  StartElement((LogParser *)&this[-1].CurChange,in_RSI,in_RDX);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    this->CData.clear();
    if (name == "logentry") {
      this->Rev = Revision();
      this->Rev.SVNInfo = &SVNRepo;
      if (const char* rev =
            cmCTestSVN::LogParser::FindAttribute(atts, "revision")) {
        this->Rev.Rev = rev;
      }
      this->Changes.clear();
    } else if (name == "path") {
      this->CurChange = Change();
      if (const char* action =
            cmCTestSVN::LogParser::FindAttribute(atts, "action")) {
        this->CurChange.Action = action[0];
      }
    }
  }